

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::XYZVisitor::update(XYZVisitor *this)

{
  SelectionSet SStack_28;
  
  if ((this->evaluator).isDynamic_ == true) {
    SelectionEvaluator::evaluate(&SStack_28,&this->evaluator);
    SelectionManager::setSelectionSet(&this->seleMan,&SStack_28);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&SStack_28.bitsets_);
  }
  return;
}

Assistant:

void XYZVisitor::update() {
    // if dynamic, we need to re-evaluate the selection
    if (evaluator.isDynamic()) {
      seleMan.setSelectionSet(evaluator.evaluate());
    }
  }